

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

void __thiscall Rml::Element::SetOwnerDocument(Element *this,ElementDocument *document)

{
  bool bVar1;
  Context *this_00;
  reference this_01;
  pointer this_02;
  ElementPtr *child;
  iterator __end2;
  iterator __begin2;
  OwnedElementList *__range2;
  Context *context;
  ElementDocument *document_local;
  Element *this_local;
  
  if (((this->owner_document != (ElementDocument *)0x0) && (document == (ElementDocument *)0x0)) &&
     (this_00 = ElementDocument::GetContext(this->owner_document), this_00 != (Context *)0x0)) {
    Context::OnElementDetach(this_00,this);
  }
  if ((this->owner_document != (ElementDocument *)this) && (this->owner_document != document)) {
    this->owner_document = document;
    __end2 = ::std::
             vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
             ::begin(&this->children);
    child = (ElementPtr *)
            ::std::
            vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
            ::end(&this->children);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_*,_std::vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>_>
                                       *)&child), bVar1) {
      this_01 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_*,_std::vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>_>
                ::operator*(&__end2);
      this_02 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->(this_01);
      SetOwnerDocument(this_02,document);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_*,_std::vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>_>
      ::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void Element::SetOwnerDocument(ElementDocument* document)
{
	if (owner_document && !document)
	{
		// We are detaching from the document and thereby also the context.
		if (Context* context = owner_document->GetContext())
			context->OnElementDetach(this);
	}

	// If this element is a document, then never change owner_document.
	if (owner_document != this && owner_document != document)
	{
		owner_document = document;
		for (ElementPtr& child : children)
			child->SetOwnerDocument(document);
	}
}